

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

void __thiscall nuraft::inmem_log_store::disk_emul_loop(inmem_log_store *this)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  pointer ppVar4;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_RDI;
  iterator entry;
  lock_guard<std::mutex> l;
  bool call_notification;
  uint64_t cur_time;
  size_t next_sleep_us;
  bool in_stack_00000087;
  raft_server *in_stack_00000088;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffd0;
  
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff98._M_node);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    EventAwaiter::wait_us
              ((EventAwaiter *)in_stack_ffffffffffffffd0._M_node,
               (size_t)in_stack_ffffffffffffffc8._M_node);
    EventAwaiter::reset((EventAwaiter *)0x19e5af);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff98._M_node);
    if (bVar1) break;
    uVar3 = timer_helper::get_timeofday_us();
    bVar1 = false;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffff88._M_node);
    std::
    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::begin((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             *)in_stack_ffffffffffffff88._M_node);
    while( true ) {
      in_stack_ffffffffffffffc8 =
           std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::end(in_stack_ffffffffffffff88._M_node);
      bVar2 = std::operator!=((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8);
      if ((!bVar2) ||
         (ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                              0x19e63e), uVar3 < ppVar4->first)) break;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)0x19e652);
      std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffffa0._M_node,
                 (__int_type)in_stack_ffffffffffffff98._M_node);
      in_stack_ffffffffffffff88 =
           std::
           map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
           ::erase_abi_cxx11_(in_RDI,in_stack_ffffffffffffff98);
      bVar1 = true;
    }
    in_stack_ffffffffffffffa0 =
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(in_stack_ffffffffffffff88._M_node);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff98 =
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff88._M_node);
    bVar2 = std::operator!=((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffff98);
    if (bVar2) {
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)0x19e717);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19e72e);
    if (bVar1) {
      raft_server::notify_log_append_completion(in_stack_00000088,in_stack_00000087);
    }
  }
  return;
}

Assistant:

void inmem_log_store::disk_emul_loop() {
    // This thread mimics async disk writes.

    size_t next_sleep_us = 100 * 1000;
    while (!disk_emul_thread_stop_signal_) {
        disk_emul_ea_.wait_us(next_sleep_us);
        disk_emul_ea_.reset();
        if (disk_emul_thread_stop_signal_) break;

        uint64_t cur_time = timer_helper::get_timeofday_us();
        next_sleep_us = 100 * 1000;

        bool call_notification = false;
        {
            std::lock_guard<std::mutex> l(logs_lock_);
            // Remove all timestamps equal to or smaller than `cur_time`,
            // and pick the greatest one among them.
            auto entry = disk_emul_logs_being_written_.begin();
            while (entry != disk_emul_logs_being_written_.end()) {
                if (entry->first <= cur_time) {
                    disk_emul_last_durable_index_ = entry->second;
                    entry = disk_emul_logs_being_written_.erase(entry);
                    call_notification = true;
                } else {
                    break;
                }
            }

            entry = disk_emul_logs_being_written_.begin();
            if (entry != disk_emul_logs_being_written_.end()) {
                next_sleep_us = entry->first - cur_time;
            }
        }

        if (call_notification) {
            raft_server_bwd_pointer_->notify_log_append_completion(true);
        }
    }
}